

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::process_stmt(Simulator *this,SwitchStmt *switch_,Var *var)

{
  unsigned_long uVar1;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *pmVar2;
  bool bVar3;
  int iVar4;
  element_type *var_00;
  mapped_type *pmVar5;
  StmtBlock *pSVar6;
  unsigned_long *puVar7;
  element_type *this_00;
  optional<unsigned_long> oVar8;
  shared_ptr<kratos::Const> local_130;
  undefined1 local_120 [8];
  mapped_type stmt_2;
  shared_ptr<kratos::Const> local_108;
  _Self local_f8;
  int64_t *local_f0;
  uint64_t bits;
  int64_t *v_p;
  int64_t cond_val;
  type *stmt_1;
  type *cond;
  _Self local_c0;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range2;
  unsigned_long value;
  undefined1 local_90 [8];
  mapped_type stmt;
  shared_ptr<kratos::Const> local_68;
  _Self local_58;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *local_50;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *body;
  optional<unsigned_long> val;
  element_type *target;
  Var *var_local;
  SwitchStmt *switch__local;
  Simulator *this_local;
  
  SwitchStmt::target((SwitchStmt *)
                     &val.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
  var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                      &val.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_long>._M_engaged);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &val.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  oVar8 = get_value_(this,var_00);
  body = oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
  val.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_50 = SwitchStmt::body(switch_);
  bVar3 = std::optional::operator_cast_to_bool((optional *)&body);
  pmVar2 = local_50;
  if (bVar3) {
    puVar7 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&body);
    pmVar2 = local_50;
    uVar1 = *puVar7;
    __end2 = std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::begin(local_50);
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::end(pmVar2);
    while (bVar3 = std::operator!=(&__end2,&local_c0), pmVar2 = local_50, bVar3) {
      cond = &std::
              _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
              ::operator*(&__end2)->first;
      stmt_1 = (type *)std::
                       get<0ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                                 ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                                   *)cond);
      cond_val = (int64_t)std::
                          get<1ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                                    ((pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>
                                      *)cond);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)stmt_1);
      if (bVar3) {
        this_00 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)stmt_1);
        local_f0 = (int64_t *)Const::value(this_00);
        bits = (uint64_t)&v_p;
        v_p = local_f0;
        iVar4 = (*(var_00->super_IRNode)._vptr_IRNode[7])();
        local_f0 = (int64_t *)(0xffffffffffffffffU >> ((byte)iVar4 & 0x3f) & (ulong)local_f0);
        if ((int64_t *)uVar1 == local_f0) {
          pSVar6 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                               cond_val)->super_StmtBlock;
          process_stmt(this,pSVar6,var);
          return;
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
      ::operator++(&__end2);
    }
    std::shared_ptr<kratos::Const>::shared_ptr(&local_108,(nullptr_t)0x0);
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::find(pmVar2,&local_108);
    stmt_2.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::end(local_50);
    bVar3 = std::operator!=(&local_f8,
                            (_Self *)&stmt_2.
                                      super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    std::shared_ptr<kratos::Const>::~shared_ptr(&local_108);
    pmVar2 = local_50;
    if (bVar3) {
      std::shared_ptr<kratos::Const>::shared_ptr(&local_130,(nullptr_t)0x0);
      pmVar5 = std::
               map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               ::at(pmVar2,&local_130);
      std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_120,pmVar5);
      std::shared_ptr<kratos::Const>::~shared_ptr(&local_130);
      pSVar6 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                           local_120)->super_StmtBlock;
      process_stmt(this,pSVar6,var);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_120);
    }
  }
  else {
    std::shared_ptr<kratos::Const>::shared_ptr(&local_68,(nullptr_t)0x0);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::find(pmVar2,&local_68);
    stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::end(local_50);
    bVar3 = std::operator!=(&local_58,
                            (_Self *)&stmt.
                                      super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    std::shared_ptr<kratos::Const>::~shared_ptr(&local_68);
    pmVar2 = local_50;
    if (bVar3) {
      std::shared_ptr<kratos::Const>::shared_ptr((shared_ptr<kratos::Const> *)&value,(nullptr_t)0x0)
      ;
      pmVar5 = std::
               map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               ::at(pmVar2,(shared_ptr<kratos::Const> *)&value);
      std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_90,pmVar5);
      std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)&value);
      pSVar6 = &std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                           local_90)->super_StmtBlock;
      process_stmt(this,pSVar6,var);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_90);
    }
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::SwitchStmt *switch_, const Var *var) {
    auto *target = switch_->target().get();
    auto val = get_value_(target);
    auto const &body = switch_->body();
    if (!val) {
        // go to default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    } else {
        auto value = *val;
        for (auto const &[cond, stmt] : body) {
            // we compare bits
            if (!cond) continue;
            int64_t cond_val = cond->value();
            int64_t *v_p = &cond_val;
            uint64_t bits = *(reinterpret_cast<uint64_t *>(v_p));
            bits &= (0xFFFFFFFFFFFFFFFF >> target->width());
            if (value == bits) {
                process_stmt(stmt.get(), var);
                return;
            }
        }
        // default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    }
}